

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

int row_mt_worker_hook(void *arg1,void *arg2)

{
  AV1_COMMON *cm_00;
  TileInfo *tile;
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ThreadData *td;
  int *piVar6;
  TileDataDec *tile_data;
  int iVar7;
  DecoderCodingBlock *pDVar8;
  DecoderCodingBlock *pDVar9;
  MACROBLOCKD *pMVar10;
  ENTROPY_CONTEXT (*paEVar11) [32];
  byte bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  TileJobsDec *pTVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  pthread_mutex_t *__mutex;
  bool bVar30;
  AV1_COMMON *cm;
  
  td = *arg1;
  (td->dcb).corrupted = 0;
  iVar13 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xe8));
  if (iVar13 == 0) {
    *(undefined4 *)((long)arg1 + 0xe0) = 1;
    if (*(int *)((long)arg2 + 0x9e44) == 0) {
      bVar12 = *(byte *)((long)arg2 + 0x3d4c) ^ 1;
    }
    else {
      bVar12 = 0;
    }
    piVar6 = &(td->dcb).corrupted;
    cm_00 = (AV1_COMMON *)((long)arg2 + 0x3b60);
    td->predict_and_recon_intra_block_visit = decode_block_void;
    td->inverse_tx_inter_block_visit = decode_block_void;
    td->predict_inter_block_visit = predict_inter_block_void;
    td->cfl_store_inter_block_visit = cfl_store_inter_block_void;
    td->read_coeffs_tx_intra_block_visit = read_coeffs_tx_intra_block;
    td->read_coeffs_tx_inter_block_visit = av1_read_coeffs_txb;
    pDVar8 = &td->dcb;
    while (*piVar6 == 0) {
      pTVar18 = get_dec_job_info((AV1DecTileMT *)((long)arg2 + 0x58d30));
      if (pTVar18 == (TileJobsDec *)0x0) {
        if (*piVar6 == 0) {
          set_decode_func_pointers(td,2);
          do {
            pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            while( true ) {
              bVar30 = true;
              iVar13 = 0;
              if (*(int *)((long)arg2 + 0x5f710) == *(int *)((long)arg2 + 0x5f708)) break;
              iVar27 = 0;
              iVar14 = 0;
              iVar13 = 0;
              if (*(int *)((long)arg2 + 0x5f714) == 1) goto LAB_001680bf;
              if (*(int *)((long)arg2 + 0x5f70c) != *(int *)((long)arg2 + 0x5f710)) {
                iVar15 = *(int *)((long)arg2 + 0x5f6f4);
                iVar17 = *(int *)((long)arg2 + 0x5f6f8);
                iVar24 = *(int *)((long)arg2 + 0x5f6fc);
                iVar3 = *(int *)((long)arg2 + 0x5f700);
                iVar4 = *(int *)((long)arg2 + 0x5f704);
                bVar12 = *(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x1c);
                iVar16 = 0;
                iVar19 = 0x7fffffff;
                uVar20 = 0xffffffffffffffff;
                iVar27 = -1;
                for (iVar13 = *(int *)((long)arg2 + 0x5f6f0); iVar14 = (int)uVar20, iVar13 < iVar15;
                    iVar13 = iVar13 + 1) {
                  uVar20 = uVar20 & 0xffffffff;
                  lVar26 = (long)iVar17 * 0x53a0;
                  for (uVar21 = (long)iVar17; (long)uVar21 < (long)iVar24; uVar21 = uVar21 + 1) {
                    iVar14 = *(int *)((long)arg2 + 0x9c00) * iVar13;
                    iVar22 = iVar14 + (int)uVar21;
                    if ((iVar3 <= iVar22) && (iVar22 <= iVar4)) {
                      lVar23 = (long)iVar14 * 0x53a0 + *(long *)((long)arg2 + 0x48d20);
                      iVar14 = *(int *)(lVar26 + 0x5394 + lVar23);
                      iVar22 = *(int *)(lVar26 + 0x538c + lVar23);
                      if (0 < (*(int *)(lVar26 + 0x5390 + lVar23) - iVar14) * iVar22) {
                        iVar5 = *(int *)(lVar26 + 0x5398 + lVar23);
                        iVar7 = iVar19;
                        if (iVar5 < iVar19) {
                          iVar16 = 0;
                          iVar7 = iVar5;
                        }
                        bVar30 = iVar5 <= iVar19;
                        iVar19 = iVar7;
                        if ((bVar30) &&
                           (iVar22 = (*(int *)(lVar26 + 0x5388 + lVar23) - iVar14) * iVar22,
                           iVar16 < iVar22)) {
                          iVar14 = get_max_row_mt_workers_per_tile
                                             (cm_00,(TileInfo *)(lVar23 + lVar26));
                          if (iVar5 < iVar14) {
                            uVar20 = uVar21 & 0xffffffff;
                            iVar16 = iVar22;
                            iVar27 = iVar13;
                          }
                        }
                      }
                    }
                    lVar26 = lVar26 + 0x53a0;
                  }
                }
                if ((iVar27 != -1) && (iVar14 != -1)) {
                  lVar26 = (long)iVar27 * (long)*(int *)((long)arg2 + 0x9c00) * 0x53a0 +
                           *(long *)((long)arg2 + 0x48d20);
                  bVar12 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [bVar12];
                  lVar23 = (long)iVar14 * 0x53a0;
                  iVar13 = *(int *)(lVar23 + 0x5394 + lVar26);
                  piVar1 = (int *)(lVar23 + 0x5398 + lVar26);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(lVar23 + 0x5394 + lVar26) = iVar13 + (uint)bVar12;
                  iVar15 = (uint)bVar12 + *(int *)((long)arg2 + 0x5f710);
                  iVar13 = *(int *)(lVar23 + lVar26) + iVar13;
                  *(int *)((long)arg2 + 0x5f710) = iVar15;
                  if (iVar15 == *(int *)((long)arg2 + 0x5f708)) {
                    pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
                  }
                  bVar30 = false;
                  goto LAB_001680bf;
                }
              }
              pthread_cond_wait(*(pthread_cond_t **)((long)arg2 + 0x5f6e8),
                                *(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            }
            iVar27 = 0;
            iVar14 = 0;
LAB_001680bf:
            pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            if (bVar30) {
              *(undefined4 *)((long)arg1 + 0xe0) = 0;
              return (uint)(*piVar6 == 0);
            }
            lVar23 = (long)*(int *)((long)arg2 + 0x9c00) * (long)iVar27 * 0x53a0 +
                     *(long *)((long)arg2 + 0x48d20);
            lVar29 = (long)iVar14 * 0x53a0;
            tile = (TileInfo *)(lVar23 + lVar29);
            av1_tile_init(&(td->dcb).xd.tile,cm_00,iVar27,iVar14);
            av1_init_macroblockd(cm_00,(MACROBLOCKD *)td);
            (td->dcb).xd.error_info = (aom_internal_error_info *)((long)arg1 + 0x10);
            bVar30 = *(char *)(*(long *)((long)arg2 + 0x9be8) + 0x4d) == '\0';
            iVar27 = *(int *)(lVar29 + 0x10 + lVar23);
            iVar14 = *(int *)((long)arg2 + 0x9c00);
            lVar26 = *(long *)((long)arg2 + 0x48d20);
            iVar15 = *(int *)(lVar29 + 0x14 + lVar23);
            iVar17 = av1_get_sb_cols_in_tile(cm_00,tile);
            iVar24 = iVar13 - *(int *)(lVar29 + lVar23) >>
                     (*(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x24) & 0x1f);
            lVar26 = (long)iVar15 * 0x53a0 + (long)iVar14 * (long)iVar27 * 0x53a0 + lVar26;
            lVar25 = (long)(iVar24 + -1);
            uVar28 = 0;
            for (iVar27 = *(int *)(lVar29 + 8 + lVar23); iVar27 < tile->mi_col_end;
                iVar27 = iVar27 + *(int *)(*(long *)((long)arg2 + 0x9be8) + 0x20)) {
              set_cb_buffer((AV1Decoder *)arg2,&td->dcb,*(CB_BUFFER **)((long)arg2 + 0x5f6d0),
                            bVar30 + 1 + (uint)bVar30,iVar13,iVar27);
              if ((iVar24 != 0) &&
                 (iVar14 = *(int *)(lVar26 + 0x5380), (iVar14 + 0x7fffffffU & uVar28) == 0)) {
                __mutex = ((AV1DecRowMTSync *)(lVar26 + 0x5360))->mutex_ + lVar25;
                pthread_mutex_lock((pthread_mutex_t *)__mutex);
                while (*(int *)(*(long *)(lVar26 + 0x5378) + lVar25 * 4) -
                       (*(int *)(lVar26 + 0x5384) + iVar14) < (int)uVar28) {
                  pthread_cond_wait((pthread_cond_t *)(lVar25 * 0x30 + *(long *)(lVar26 + 0x5368)),
                                    (pthread_mutex_t *)__mutex);
                }
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              }
              pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
              iVar14 = *(int *)((long)arg2 + 0x5f714);
              pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
              if (iVar14 == 0) {
                decode_partition((AV1Decoder *)arg2,td,iVar13,iVar27,td->bit_reader,
                                 *(BLOCK_SIZE *)(*(long *)((long)arg2 + 0x9be8) + 0x1c),2);
              }
              sync_write((AV1DecRowMTSync *)(lVar26 + 0x5360),iVar24,uVar28,iVar17);
              uVar28 = uVar28 + 1;
            }
            pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            tile[0x37b].tile_row = tile[0x37b].tile_row + -1;
            pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
          } while( true );
        }
        break;
      }
      tile_data = pTVar18->tile_data;
      tile_worker_hook_init
                ((AV1Decoder *)arg2,(DecWorkerData *)arg1,pTVar18->tile_buffer,tile_data,bVar12);
      pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      piVar1 = &(tile_data->dec_row_mt_sync).num_threads_working;
      *piVar1 = *piVar1 + 1;
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [*(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x1c)];
      bVar30 = *(char *)(*(long *)((long)arg2 + 0x9be8) + 0x4d) == '\0';
      iVar27 = bVar30 + 1 + (uint)bVar30;
      av1_zero_above_context
                (cm_00,(MACROBLOCKD *)td,(tile_data->tile_info).mi_col_start,
                 (tile_data->tile_info).mi_col_end,(tile_data->tile_info).tile_row);
      av1_reset_loop_filter_delta((MACROBLOCKD *)td,iVar27);
      av1_reset_loop_restoration((MACROBLOCKD *)td,iVar27);
      for (iVar13 = (tile_data->tile_info).mi_row_start; iVar13 < (tile_data->tile_info).mi_row_end;
          iVar13 = iVar13 + *(int *)(*(long *)((long)arg2 + 0x9be8) + 0x20)) {
        paEVar11 = (td->dcb).xd.left_entropy_context;
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x10) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x11) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x12) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x13) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x14) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x15) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x16) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x17) = '\0';
        paEVar11 = (td->dcb).xd.left_entropy_context;
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x18) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x19) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x1a) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x1b) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x1c) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x1d) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x1e) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0x1f) = '\0';
        pMVar10 = &(td->dcb).xd;
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 0) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 1) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 2) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 3) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 4) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 5) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 6) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 2) + 7) = '\0';
        paEVar11 = (td->dcb).xd.left_entropy_context;
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 8) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 9) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 10) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0xb) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0xc) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0xd) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0xe) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 2) + 0xf) = '\0';
        paEVar11 = (td->dcb).xd.left_entropy_context;
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x10) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x11) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x12) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x13) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x14) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x15) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x16) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x17) = '\0';
        paEVar11 = (td->dcb).xd.left_entropy_context;
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x18) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x19) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x1a) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x1b) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x1c) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x1d) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x1e) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0x1f) = '\0';
        pMVar10 = &(td->dcb).xd;
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 0) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 1) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 2) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 3) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 4) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 5) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 6) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 1) + 7) = '\0';
        paEVar11 = (td->dcb).xd.left_entropy_context;
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 8) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 9) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 10) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0xb) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0xc) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0xd) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0xe) = '\0';
        *(ENTROPY_CONTEXT *)((long)(paEVar11 + 1) + 0xf) = '\0';
        pMVar10 = &(td->dcb).xd;
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x10) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x11) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x12) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x13) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x14) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x15) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x16) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x17) = '\0';
        pMVar10 = &(td->dcb).xd;
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x18) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x19) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x1a) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x1b) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x1c) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x1d) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x1e) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0x1f) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 0) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 1) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 2) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 3) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 4) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 5) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 6) = '\0';
        *(ENTROPY_CONTEXT *)((long)((pDVar8->xd).left_entropy_context + 0) + 7) = '\0';
        pMVar10 = &(td->dcb).xd;
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 8) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 9) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 10) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0xb) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0xc) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0xd) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0xe) = '\0';
        *(ENTROPY_CONTEXT *)((long)(pMVar10->left_entropy_context + 0) + 0xf) = '\0';
        pDVar9 = &td->dcb;
        (pDVar9->xd).left_partition_context[0x10] = '\0';
        (pDVar9->xd).left_partition_context[0x11] = '\0';
        (pDVar9->xd).left_partition_context[0x12] = '\0';
        (pDVar9->xd).left_partition_context[0x13] = '\0';
        (pDVar9->xd).left_partition_context[0x14] = '\0';
        (pDVar9->xd).left_partition_context[0x15] = '\0';
        (pDVar9->xd).left_partition_context[0x16] = '\0';
        (pDVar9->xd).left_partition_context[0x17] = '\0';
        pDVar9 = &td->dcb;
        (pDVar9->xd).left_partition_context[0x18] = '\0';
        (pDVar9->xd).left_partition_context[0x19] = '\0';
        (pDVar9->xd).left_partition_context[0x1a] = '\0';
        (pDVar9->xd).left_partition_context[0x1b] = '\0';
        (pDVar9->xd).left_partition_context[0x1c] = '\0';
        (pDVar9->xd).left_partition_context[0x1d] = '\0';
        (pDVar9->xd).left_partition_context[0x1e] = '\0';
        (pDVar9->xd).left_partition_context[0x1f] = '\0';
        (td->dcb).xd.left_partition_context[0] = '\0';
        (td->dcb).xd.left_partition_context[1] = '\0';
        (td->dcb).xd.left_partition_context[2] = '\0';
        (td->dcb).xd.left_partition_context[3] = '\0';
        (td->dcb).xd.left_partition_context[4] = '\0';
        (td->dcb).xd.left_partition_context[5] = '\0';
        (td->dcb).xd.left_partition_context[6] = '\0';
        (td->dcb).xd.left_partition_context[7] = '\0';
        pDVar9 = &td->dcb;
        (pDVar9->xd).left_partition_context[8] = '\0';
        (pDVar9->xd).left_partition_context[9] = '\0';
        (pDVar9->xd).left_partition_context[10] = '\0';
        (pDVar9->xd).left_partition_context[0xb] = '\0';
        (pDVar9->xd).left_partition_context[0xc] = '\0';
        (pDVar9->xd).left_partition_context[0xd] = '\0';
        (pDVar9->xd).left_partition_context[0xe] = '\0';
        (pDVar9->xd).left_partition_context[0xf] = '\0';
        builtin_memcpy((td->dcb).xd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x20
                      );
        for (iVar14 = (tile_data->tile_info).mi_col_start;
            iVar14 < (tile_data->tile_info).mi_col_end;
            iVar14 = iVar14 + *(int *)(*(long *)((long)arg2 + 0x9be8) + 0x20)) {
          set_cb_buffer((AV1Decoder *)arg2,&td->dcb,*(CB_BUFFER **)((long)arg2 + 0x5f6d0),iVar27,
                        iVar13,iVar14);
          decode_partition((AV1Decoder *)arg2,td,iVar13,iVar14,td->bit_reader,
                           *(BLOCK_SIZE *)(*(long *)((long)arg2 + 0x9be8) + 0x1c),1);
          iVar15 = aom_reader_has_overflowed(td->bit_reader);
          if (iVar15 != 0) {
            uVar28 = 1;
            goto LAB_00167d43;
          }
        }
        pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        piVar1 = &(tile_data->dec_row_mt_sync).mi_rows_parse_done;
        *piVar1 = *piVar1 + (uint)bVar2;
        *(int *)((long)arg2 + 0x5f70c) = *(int *)((long)arg2 + 0x5f70c) + (uint)bVar2;
        pthread_cond_signal(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      }
      iVar13 = check_trailing_bits_after_symbol_coder(td->bit_reader);
      uVar28 = (uint)(iVar13 != 0);
LAB_00167d43:
      aom_merge_corrupted_flag(piVar6,uVar28);
      pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      piVar1 = &(tile_data->dec_row_mt_sync).num_threads_working;
      *piVar1 = *piVar1 + -1;
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    }
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    *(undefined4 *)((long)arg2 + 0x5f714) = 1;
    pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    *(undefined4 *)(*arg1 + 0x3ad0) = 1;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    *(undefined4 *)((long)arg2 + 0x5f714) = 1;
    pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    piVar6 = *arg1;
    iVar13 = *piVar6;
    iVar27 = piVar6[0x7a8];
    bVar12 = *(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x24);
    iVar14 = av1_get_sb_cols_in_tile
                       ((AV1_COMMON *)((long)arg2 + 0x3b60),(TileInfo *)(piVar6 + 0x7a8));
    sync_write((AV1DecRowMTSync *)
               ((long)piVar6[0x7ad] * 0x53a0 +
                (long)*(int *)((long)arg2 + 0x9c00) * (long)piVar6[0x7ac] * 0x53a0 +
                *(long *)((long)arg2 + 0x48d20) + 0x5360),iVar13 - iVar27 >> (bVar12 & 0x1f),
               iVar14 + -1,iVar14);
  }
  return 0;
}

Assistant:

static int row_mt_worker_hook(void *arg1, void *arg2) {
  DecWorkerData *const thread_data = (DecWorkerData *)arg1;
  AV1Decoder *const pbi = (AV1Decoder *)arg2;
  ThreadData *const td = thread_data->td;
  uint8_t allow_update_cdf;
  AV1DecRowMTInfo *frame_row_mt_info = &pbi->frame_row_mt_info;
  td->dcb.corrupted = 0;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(thread_data->error_info.jmp)) {
    thread_data->error_info.setjmp = 0;
    thread_data->td->dcb.corrupted = 1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    // If any SB row (erroneous row) processed by a thread encounters an
    // internal error, there is a need to indicate other threads that decoding
    // of the erroneous row is complete. This ensures that other threads which
    // wait upon the completion of SB's present in erroneous row are not waiting
    // indefinitely.
    signal_decoding_done_for_erroneous_row(pbi, &thread_data->td->dcb.xd);
    return 0;
  }
  thread_data->error_info.setjmp = 1;

  AV1_COMMON *cm = &pbi->common;
  allow_update_cdf = cm->tiles.large_scale ? 0 : 1;
  allow_update_cdf = allow_update_cdf && !cm->features.disable_cdf_update;

  set_decode_func_pointers(td, 0x1);

  assert(cm->tiles.cols > 0);
  while (!td->dcb.corrupted) {
    TileJobsDec *cur_job_info = get_dec_job_info(&pbi->tile_mt_info);

    if (cur_job_info != NULL) {
      const TileBufferDec *const tile_buffer = cur_job_info->tile_buffer;
      TileDataDec *const tile_data = cur_job_info->tile_data;
      tile_worker_hook_init(pbi, thread_data, tile_buffer, tile_data,
                            allow_update_cdf);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working++;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
      // decode tile
      parse_tile_row_mt(pbi, td, tile_data);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working--;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    } else {
      break;
    }
  }

  if (td->dcb.corrupted) {
    thread_data->error_info.setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    return 0;
  }

  set_decode_func_pointers(td, 0x2);

  while (1) {
    AV1DecRowMTJobInfo next_job_info;
    int end_of_frame = 0;

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    while (!get_next_job_info(pbi, &next_job_info, &end_of_frame)) {
#if CONFIG_MULTITHREAD
      pthread_cond_wait(pbi->row_mt_cond_, pbi->row_mt_mutex_);
#endif
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif

    if (end_of_frame) break;

    int tile_row = next_job_info.tile_row;
    int tile_col = next_job_info.tile_col;
    int mi_row = next_job_info.mi_row;

    TileDataDec *tile_data =
        pbi->tile_data + tile_row * cm->tiles.cols + tile_col;
    AV1DecRowMTSync *dec_row_mt_sync = &tile_data->dec_row_mt_sync;

    av1_tile_init(&td->dcb.xd.tile, cm, tile_row, tile_col);
    av1_init_macroblockd(cm, &td->dcb.xd);
    td->dcb.xd.error_info = &thread_data->error_info;

    decode_tile_sb_row(pbi, td, &tile_data->tile_info, mi_row);

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    dec_row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
  }
  thread_data->error_info.setjmp = 0;
  return !td->dcb.corrupted;
}